

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
::operator()(CallDeleter<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
             *this,_func_void_BasicStringView<const_char>_ptr_size_t *deleter,
            BasicStringView<const_char> *data,size_t size)

{
  if (deleter != (_func_void_BasicStringView<const_char>_ptr_size_t *)0x0) {
    (*deleter)(data,size);
    return;
  }
  if (data != (BasicStringView<const_char> *)0x0) {
    operator_delete__(data);
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }